

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.h
# Opt level: O0

void __thiscall Server<Client>::start(Server<Client> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  socklen_t *in_RCX;
  sockaddr *__addr;
  anon_class_16_2_37edc3c6_for__M_fn local_38;
  undefined1 local_28 [8];
  packaged_task<void_()> task;
  Client cl;
  Server<Client> *this_local;
  
  std::atomic<bool>::operator=(&this->is_working,true);
  while( true ) {
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)this);
    if (!bVar1) break;
    this_00 = &task._M_state.
               super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount;
    Acceptor<Client>::accept((Acceptor<Client> *)this_00,(int)this + 8,__addr,in_RCX);
    local_38.this = this;
    Client::Client(&local_38.client,(Client *)this_00);
    std::packaged_task<void()>::packaged_task<Server<Client>::start()::_lambda()_1_,void>
              ((packaged_task<void()> *)local_28,&local_38);
    start()::{lambda()#1}::~start((_lambda___1_ *)&local_38);
    ThreadPool<std::packaged_task<void_()>_>::push
              (&this->thread_pool,(packaged_task<void_()> *)local_28);
    std::packaged_task<void_()>::~packaged_task((packaged_task<void_()> *)local_28);
    Client::~Client((Client *)
                    &task._M_state.
                     super___shared_ptr<std::__future_base::_Task_state_base<void_()>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  }
  return;
}

Assistant:

void Server<T>::start() {
    is_working = true;
    while(is_working) {
        T cl(acceptor.accept());
        std::packaged_task<void(void)> task(
            [this, client = std::move(cl)] () mutable {
                handler.handle(std::move(client));
            }
        );
        thread_pool.push(std::move(task));
    }
}